

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::updateSingleAabb(cbtCollisionWorld *this,cbtCollisionObject *colObj)

{
  cbtIDebugDraw *pcVar1;
  undefined1 auVar2 [16];
  cbtVector3 maxAabb;
  cbtVector3 minAabb;
  cbtVector3 maxAabb2;
  cbtVector3 minAabb2;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  cbtScalar local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  (*colObj->m_collisionShape->_vptr_cbtCollisionShape[2])
            (colObj->m_collisionShape,&colObj->m_worldTransform,&local_54,&local_64);
  if ((((this->m_dispatchInfo).m_useContinuous == true) && (colObj->m_internalType == 2)) &&
     ((colObj->m_collisionFlags & 3) == 0)) {
    local_44 = gContactBreakingThreshold;
    (*colObj->m_collisionShape->_vptr_cbtCollisionShape[2])
              (colObj->m_collisionShape,&colObj->m_interpolationWorldTransform,&local_30,&local_40);
    local_30 = local_30 - local_44;
    local_2c = local_2c - local_44;
    local_28 = local_28 - local_44;
    local_40 = local_44 + local_40;
    local_3c = local_44 + local_3c;
    local_38 = local_44 + local_38;
    if (local_30 < local_54) {
      local_54 = local_30;
    }
    if (local_2c < local_50) {
      local_50 = local_2c;
    }
    if (local_28 < local_4c) {
      local_4c = local_28;
    }
    if (local_24 < local_48) {
      local_48 = local_24;
    }
    if (local_64 < local_40) {
      local_64 = local_40;
    }
    if (local_60 < local_3c) {
      local_60 = local_3c;
    }
    if (local_5c < local_38) {
      local_5c = local_38;
    }
    if (local_58 < local_34) {
      local_58 = local_34;
    }
  }
  if ((colObj->m_collisionFlags & 1) == 0) {
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)((local_60 - local_50) * (local_60 - local_50))),
                             ZEXT416((uint)(local_64 - local_54)),
                             ZEXT416((uint)(local_64 - local_54)));
    auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)(local_5c - local_4c)),
                             ZEXT416((uint)(local_5c - local_4c)));
    if (1e+12 <= auVar2._0_4_) {
      cbtCollisionObject::setActivationState(colObj,5);
      if (updateSingleAabb(cbtCollisionObject*)::reportMe != '\0') {
        return;
      }
      pcVar1 = this->m_debugDrawer;
      if (pcVar1 == (cbtIDebugDraw *)0x0) {
        return;
      }
      updateSingleAabb(cbtCollisionObject*)::reportMe = '\x01';
      (*pcVar1->_vptr_cbtIDebugDraw[0xb])(pcVar1,"Overflow in AABB, object removed from simulation")
      ;
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])
                (this->m_debugDrawer,
                 "If you can reproduce this, please email bugs@continuousphysics.com\n");
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])
                (this->m_debugDrawer,
                 "Please include above information, your Platform, version of OS.\n");
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])(this->m_debugDrawer,"Thanks.\n");
      return;
    }
  }
  (*this->m_broadphasePairCache->_vptr_cbtBroadphaseInterface[4])
            (this->m_broadphasePairCache,colObj->m_broadphaseHandle,&local_54,&local_64,
             this->m_dispatcher1);
  return;
}

Assistant:

void cbtCollisionWorld::updateSingleAabb(cbtCollisionObject* colObj)
{
	cbtVector3 minAabb, maxAabb;
	colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(), minAabb, maxAabb);
	//need to increase the aabb for contact thresholds
	cbtVector3 contactThreshold(gContactBreakingThreshold, gContactBreakingThreshold, gContactBreakingThreshold);
    /* ***CHRONO*** minAabb and maxAabb not needed because the margin in Chrono also icludes the contact braking layer */
	////minAabb -= contactThreshold;
	////maxAabb += contactThreshold;

	if (getDispatchInfo().m_useContinuous && colObj->getInternalType() == cbtCollisionObject::CO_RIGID_BODY && !colObj->isStaticOrKinematicObject())
	{
		cbtVector3 minAabb2, maxAabb2;
		colObj->getCollisionShape()->getAabb(colObj->getInterpolationWorldTransform(), minAabb2, maxAabb2);
		minAabb2 -= contactThreshold;
		maxAabb2 += contactThreshold;
		minAabb.setMin(minAabb2);
		maxAabb.setMax(maxAabb2);
	}

	cbtBroadphaseInterface* bp = (cbtBroadphaseInterface*)m_broadphasePairCache;

	//moving objects should be moderately sized, probably something wrong if not
	if (colObj->isStaticObject() || ((maxAabb - minAabb).length2() < cbtScalar(1e12)))
	{
		bp->setAabb(colObj->getBroadphaseHandle(), minAabb, maxAabb, m_dispatcher1);
	}
	else
	{
		//something went wrong, investigate
		//this assert is unwanted in 3D modelers (danger of loosing work)
		colObj->setActivationState(DISABLE_SIMULATION);

		static bool reportMe = true;
		if (reportMe && m_debugDrawer)
		{
			reportMe = false;
			m_debugDrawer->reportErrorWarning("Overflow in AABB, object removed from simulation");
			m_debugDrawer->reportErrorWarning("If you can reproduce this, please email bugs@continuousphysics.com\n");
			m_debugDrawer->reportErrorWarning("Please include above information, your Platform, version of OS.\n");
			m_debugDrawer->reportErrorWarning("Thanks.\n");
		}
	}
}